

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataViewDefault.cpp
# Opt level: O2

bool __thiscall Rml::DataViewText::Update(DataViewText *this,DataModel *model)

{
  pointer pDVar1;
  code *pcVar2;
  bool bVar3;
  bool bVar4;
  Element *pEVar5;
  SystemInterface *pSVar6;
  ElementText *this_00;
  pointer pDVar7;
  String value;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  Variant variant;
  DataExpressionInterface expression_interface;
  
  pEVar5 = DataView::GetElement(&this->super_DataView);
  bVar4 = false;
  DataExpressionInterface::DataExpressionInterface(&expression_interface,model,pEVar5,(Event *)0x0);
  pDVar7 = (this->data_entries).
           super__Vector_base<Rml::DataViewText::DataEntry,_std::allocator<Rml::DataViewText::DataEntry>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pDVar1 = (this->data_entries).
           super__Vector_base<Rml::DataViewText::DataEntry,_std::allocator<Rml::DataViewText::DataEntry>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  do {
    if (pDVar7 == pDVar1) {
      if (bVar4) {
        pEVar5 = DataView::GetElement(&this->super_DataView);
        if (pEVar5 == (Element *)0x0) {
          Log::Message(LT_WARNING,
                       "Could not update data view text, element no longer valid. Was it destroyed?"
                      );
        }
        else {
          BuildText_abi_cxx11_((String *)&variant,this);
          value._M_dataplus._M_p = (pointer)&value.field_2;
          value._M_string_length = 0;
          value.field_2._M_local_buf[0] = '\0';
          pSVar6 = GetSystemInterface();
          if (pSVar6 != (SystemInterface *)0x0) {
            (*pSVar6->_vptr_SystemInterface[3])(pSVar6,&value,&variant);
          }
          this_00 = rmlui_static_cast<Rml::ElementText*,Rml::Element*>(pEVar5);
          ElementText::SetText(this_00,&value);
          ::std::__cxx11::string::~string((string *)&value);
          ::std::__cxx11::string::~string((string *)&variant);
        }
      }
      return bVar4;
    }
    if ((pDVar7->data_expression)._M_t.
        super___uniq_ptr_impl<Rml::DataExpression,_std::default_delete<Rml::DataExpression>_>._M_t.
        super__Tuple_impl<0UL,_Rml::DataExpression_*,_std::default_delete<Rml::DataExpression>_>.
        super__Head_base<0UL,_Rml::DataExpression_*,_false>._M_head_impl == (DataExpression *)0x0) {
      bVar3 = Assert("RMLUI_ASSERT(entry.data_expression)",
                     "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/DataViewDefault.cpp"
                     ,0x17a);
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
    }
    Variant::Variant(&variant);
    bVar3 = DataExpression::Run((pDVar7->data_expression)._M_t.
                                super___uniq_ptr_impl<Rml::DataExpression,_std::default_delete<Rml::DataExpression>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_Rml::DataExpression_*,_std::default_delete<Rml::DataExpression>_>
                                .super__Head_base<0UL,_Rml::DataExpression_*,_false>._M_head_impl,
                                &expression_interface,&variant);
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    local_90._M_string_length = 0;
    local_90.field_2._M_local_buf[0] = '\0';
    Variant::Get<std::__cxx11::string>(&value,&variant,&local_90);
    ::std::__cxx11::string::~string((string *)&local_90);
    if (bVar3) {
      bVar3 = ::std::operator!=(&pDVar7->value,&value);
      if (bVar3) {
        bVar4 = true;
        ::std::__cxx11::string::_M_assign((string *)&pDVar7->value);
      }
    }
    ::std::__cxx11::string::~string((string *)&value);
    Variant::~Variant(&variant);
    pDVar7 = pDVar7 + 1;
  } while( true );
}

Assistant:

bool DataViewText::Update(DataModel& model)
{
	bool entries_modified = false;
	{
		Element* element = GetElement();
		DataExpressionInterface expression_interface(&model, element);

		for (DataEntry& entry : data_entries)
		{
			RMLUI_ASSERT(entry.data_expression);
			Variant variant;
			bool result = entry.data_expression->Run(expression_interface, variant);
			const String value = variant.Get<String>();
			if (result && entry.value != value)
			{
				entry.value = value;
				entries_modified = true;
			}
		}
	}

	if (entries_modified)
	{
		if (Element* element = GetElement())
		{
			String new_text = BuildText();
			String text;
			if (SystemInterface* system_interface = GetSystemInterface())
				system_interface->TranslateString(text, new_text);

			rmlui_static_cast<ElementText*>(element)->SetText(text);
		}
		else
		{
			Log::Message(Log::LT_WARNING, "Could not update data view text, element no longer valid. Was it destroyed?");
		}
	}

	return entries_modified;
}